

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNpn2.c
# Opt level: O0

void Dtt_EnumerateLf(int nVars,int nNodeMax,int fDelay,int fMulti,int fVerbose,char *pFileName)

{
  Vec_Wec_t *p_00;
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  abctime clk_00;
  Dtt_Man_t *p_01;
  Vec_Int_t *pVVar6;
  Vec_Int_t *p_02;
  Vec_Int_t *p_03;
  int local_bc;
  uint TruthJ;
  uint Truth;
  int Start;
  Vec_Int_t *vFuns;
  uint TruthI;
  int EntryJ;
  int EntryI;
  int j0;
  int i0;
  int k;
  Vec_Int_t *vFaninJ;
  Vec_Int_t *vFaninI;
  int local_50;
  int j;
  int i;
  int n;
  Dtt_Man_t *p;
  word nMultis;
  word nSteps;
  abctime clk;
  char *pFileName_local;
  int fVerbose_local;
  int fMulti_local;
  int fDelay_local;
  int nNodeMax_local;
  int nVars_local;
  
  clk_00 = Abc_Clock();
  nMultis = 0;
  p = (Dtt_Man_t *)0x0;
  p_01 = Dtt_ManAlloc(nVars,fMulti);
  Vec_IntPushTwo(p_01->vFanins,0,0);
  Vec_IntPush(p_01->vTruths,0);
  Vec_IntPush(p_01->vConfigs,0);
  pVVar6 = p_01->vClasses;
  iVar1 = Vec_IntSize(p_01->vTruthNpns);
  Vec_IntPush(pVVar6,iVar1);
  Vec_IntPush(p_01->vTruthNpns,0);
  Dtt_ManSetFun(p_01,0);
  p_00 = p_01->vFunNodes;
  iVar1 = Vec_IntSize(p_01->vFanins);
  Vec_WecPush(p_00,0,iVar1 / 2);
  Vec_IntPushTwo(p_01->vFanins,0,0);
  Vec_IntPush(p_01->vTruths,(int)s_Truths6[0]);
  Vec_IntPush(p_01->vConfigs,0);
  pVVar6 = p_01->vClasses;
  iVar1 = Vec_IntSize(p_01->vTruthNpns);
  Vec_IntPush(pVVar6,iVar1);
  Vec_IntPush(p_01->vTruthNpns,(int)s_Truths6[0]);
  for (local_50 = 0; local_50 < nVars; local_50 = local_50 + 1) {
    Dtt_ManSetFun(p_01,(uint)s_Truths6[local_50]);
  }
  p_01->Counts[0] = 2;
  Dtt_PrintStats(0,nVars,p_01->vFunNodes,0,clk_00,fDelay,0);
  for (j = 1; j <= nNodeMax; j = j + 1) {
    vFaninI._4_4_ = j + -1;
    for (local_50 = 0; local_50 < j; local_50 = local_50 + 1) {
      if (local_50 <= vFaninI._4_4_) {
        pVVar6 = Vec_WecEntry(p_01->vFunNodes,local_50);
        p_02 = Vec_WecEntry(p_01->vFunNodes,vFaninI._4_4_);
        for (EntryI = 0; iVar1 = Vec_IntSize(pVVar6), EntryI < iVar1; EntryI = EntryI + 1) {
          iVar1 = Vec_IntEntry(pVVar6,EntryI);
          uVar2 = Vec_IntEntry(p_01->vTruths,iVar1);
          p_03 = Dtt_ManCollect(p_01,uVar2,p_01->vTemp);
          if (local_50 == vFaninI._4_4_) {
            local_bc = EntryI;
          }
          else {
            local_bc = 0;
          }
          for (EntryJ = local_bc; iVar3 = Vec_IntSize(p_02), EntryJ < iVar3; EntryJ = EntryJ + 1) {
            iVar3 = Vec_IntEntry(p_02,EntryJ);
            uVar2 = Vec_IntEntry(p_01->vTruths,iVar3);
            for (j0 = 0; iVar4 = Vec_IntSize(p_03), j0 < iVar4; j0 = j0 + 1) {
              uVar5 = Vec_IntEntry(p_03,j0);
              iVar4 = Dtt_ManGetFun(p_01,uVar2 & uVar5,j);
              if (iVar4 == 0) {
                Dtt_ManAddFunction(p_01,j,iVar1,iVar3,0,uVar2 & uVar5);
              }
              iVar4 = Dtt_ManGetFun(p_01,uVar2 & (uVar5 ^ 0xffffffff),j);
              if (iVar4 == 0) {
                Dtt_ManAddFunction(p_01,j,iVar1,iVar3,1,uVar2 & (uVar5 ^ 0xffffffff));
              }
              iVar4 = Dtt_ManGetFun(p_01,(uVar2 ^ 0xffffffff) & uVar5,j);
              if (iVar4 == 0) {
                Dtt_ManAddFunction(p_01,j,iVar1,iVar3,2,(uVar2 ^ 0xffffffff) & uVar5);
              }
              iVar4 = Dtt_ManGetFun(p_01,uVar2 | uVar5,j);
              if (iVar4 == 0) {
                Dtt_ManAddFunction(p_01,j,iVar1,iVar3,3,uVar2 | uVar5);
              }
              iVar4 = Dtt_ManGetFun(p_01,uVar2 ^ uVar5,j);
              if (iVar4 == 0) {
                Dtt_ManAddFunction(p_01,j,iVar1,iVar3,4,uVar2 ^ uVar5);
              }
              nMultis = nMultis + 5;
              if (p_01->pTable != (uint *)0x0) {
                Dtt_ManAddVisited(p_01,uVar2 & uVar5,j);
              }
              if (p_01->pTable != (uint *)0x0) {
                Dtt_ManAddVisited(p_01,uVar2 & (uVar5 ^ 0xffffffff),j);
              }
              if (p_01->pTable != (uint *)0x0) {
                Dtt_ManAddVisited(p_01,(uVar2 ^ 0xffffffff) & uVar5,j);
              }
              if (p_01->pTable != (uint *)0x0) {
                Dtt_ManAddVisited(p_01,uVar2 | uVar5,j);
              }
              if (p_01->pTable != (uint *)0x0) {
                Dtt_ManAddVisited(p_01,uVar2 ^ uVar5,j);
              }
            }
            p = (Dtt_Man_t *)((long)&p->nVars + 1);
            if (p_01->pTable != (uint *)0x0) {
              Dtt_ManProcessVisited(p_01);
            }
          }
        }
      }
      vFaninI._4_4_ = vFaninI._4_4_ + -1 + fDelay;
    }
    iVar1 = Dtt_PrintStats(j,nVars,p_01->vFunNodes,nMultis,clk_00,fDelay,(word)p);
    if (iVar1 == 0) break;
  }
  if (fDelay == 0) {
    if (pFileName != (char *)0x0) {
      Dtt_DumpLibrary(p_01,pFileName);
    }
  }
  else {
    Dtt_PrintDistrib(p_01);
  }
  Dtt_ManFree(p_01);
  return;
}

Assistant:

void Dtt_EnumerateLf( int nVars, int nNodeMax, int fDelay, int fMulti, int fVerbose, char* pFileName )
{
    abctime clk = Abc_Clock(); word nSteps = 0, nMultis = 0;
    Dtt_Man_t * p = Dtt_ManAlloc( nVars, fMulti ); int n, i, j;

    // constant zero class
    Vec_IntPushTwo( p->vFanins, 0, 0 );
    Vec_IntPush( p->vTruths, 0 );
    Vec_IntPush( p->vConfigs, 0 );
    Vec_IntPush( p->vClasses, Vec_IntSize(p->vTruthNpns) );
    Vec_IntPush( p->vTruthNpns, 0 );
    Dtt_ManSetFun( p, 0 );
    // buffer class
    Vec_WecPush( p->vFunNodes, 0, Vec_IntSize(p->vFanins)/2 );
    Vec_IntPushTwo( p->vFanins, 0, 0 );
    Vec_IntPush( p->vTruths, (unsigned)s_Truths6[0] );
    Vec_IntPush( p->vConfigs, 0 );
    Vec_IntPush( p->vClasses, Vec_IntSize(p->vTruthNpns) );
    Vec_IntPush( p->vTruthNpns, (unsigned)s_Truths6[0] );
    for ( i = 0; i < nVars; i++ )
        Dtt_ManSetFun( p, (unsigned)s_Truths6[i] );
    p->Counts[0] = 2;
    // enumerate
    Dtt_PrintStats(0, nVars, p->vFunNodes, nSteps, clk, fDelay, 0);
    for ( n = 1; n <= nNodeMax; n++ )
    {
        for ( i = 0, j = n - 1; i < n; i++, j = j - 1 + fDelay ) if ( i <= j )
        {
            Vec_Int_t * vFaninI = Vec_WecEntry( p->vFunNodes, i );
            Vec_Int_t * vFaninJ = Vec_WecEntry( p->vFunNodes, j );
            int k, i0, j0, EntryI, EntryJ;
            Vec_IntForEachEntry( vFaninI, EntryI, i0 )
            {
                unsigned TruthI = Vec_IntEntry(p->vTruths, EntryI);
                Vec_Int_t * vFuns = Dtt_ManCollect( p, TruthI, p->vTemp );
                int Start = i == j ? i0 : 0;
                Vec_IntForEachEntryStart( vFaninJ, EntryJ, j0, Start )
                {
                    unsigned Truth, TruthJ = Vec_IntEntry(p->vTruths, EntryJ);
                    Vec_IntForEachEntry( vFuns, Truth, k )
                    {
                        if ( !Dtt_ManGetFun(p,  TruthJ &  Truth, n) )
                            Dtt_ManAddFunction( p, n, EntryI, EntryJ, 0,  TruthJ &  Truth );
                        if ( !Dtt_ManGetFun(p,  TruthJ & ~Truth, n) )
                            Dtt_ManAddFunction( p, n, EntryI, EntryJ, 1,  TruthJ & ~Truth );
                        if ( !Dtt_ManGetFun(p, ~TruthJ &  Truth, n) )
                            Dtt_ManAddFunction( p, n, EntryI, EntryJ, 2, ~TruthJ &  Truth );
                        if ( !Dtt_ManGetFun(p,  TruthJ |  Truth, n) )
                            Dtt_ManAddFunction( p, n, EntryI, EntryJ, 3,  TruthJ |  Truth );
                        if ( !Dtt_ManGetFun(p,  TruthJ ^  Truth, n) )
                            Dtt_ManAddFunction( p, n, EntryI, EntryJ, 4,  TruthJ ^  Truth );
                        nSteps += 5;

                        if ( p->pTable ) Dtt_ManAddVisited( p,  TruthJ &  Truth, n );
                        if ( p->pTable ) Dtt_ManAddVisited( p,  TruthJ & ~Truth, n );
                        if ( p->pTable ) Dtt_ManAddVisited( p, ~TruthJ &  Truth, n );
                        if ( p->pTable ) Dtt_ManAddVisited( p,  TruthJ |  Truth, n );
                        if ( p->pTable ) Dtt_ManAddVisited( p,  TruthJ ^  Truth, n );
                    }
                    nMultis++;
                    if ( p->pTable ) Dtt_ManProcessVisited( p );
                }
            }
        }
        if ( Dtt_PrintStats(n, nVars, p->vFunNodes, nSteps, clk, fDelay, nMultis) == 0 )
            break;
    }
    if ( fDelay )
        Dtt_PrintDistrib( p );
    //if ( p->pTable ) 
        //Dtt_PrintMulti( p );
    if ( !fDelay && pFileName!=NULL )
        Dtt_DumpLibrary( p, pFileName );
    Dtt_ManFree( p );
}